

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Statement> __thiscall Parser::forStatement(Parser *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Statement> pVar3;
  Identifier identifier;
  ptr<StatementBlock> statBlock;
  ptr<Expression> iterable;
  undefined1 local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  shared_ptr<StatementBlock> local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_38;
  _Alloc_hider _Stack_28;
  
  consume(in_RSI);
  local_58._0_4_ = (in_RSI->currentToken).type;
  pcVar1 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (in_RSI->currentToken).lexeme._M_string_length);
  aStack_38._8_8_ = (in_RSI->currentToken).line;
  _Stack_28._M_p = (pointer)(in_RSI->currentToken).col;
  if (local_50._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8)) {
    local_98.field_2._8_8_ = aStack_38._M_allocated_capacity;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)local_50._M_pi;
  }
  local_98.field_2._M_allocated_capacity = local_48._8_8_;
  local_98._M_string_length = local_48._0_8_;
  consume(in_RSI,Identifier,"identifier");
  consume(in_RSI,In,"\'in\'");
  expression((Parser *)local_58);
  in_RSI->functionCounter = in_RSI->functionCounter + 1;
  statementBlock((Parser *)&local_78);
  in_RSI->functionCounter = in_RSI->functionCounter + -1;
  local_68._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ForStatement,std::allocator<ForStatement>,std::__cxx11::string&,std::shared_ptr<Expression>&,std::shared_ptr<StatementBlock>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8),(ForStatement **)local_68,
             (allocator<ForStatement> *)&local_99,&local_98,(shared_ptr<Expression> *)local_58,
             &local_78);
  (this->filepath)._M_dataplus._M_p = (pointer)local_68._0_8_;
  (this->filepath)._M_string_length = local_68._8_8_;
  _Var2._M_pi = extraout_RDX;
  if (local_78.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    _Var2._M_pi = extraout_RDX_02;
  }
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::forStatement() {
    consume();
    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier, "identifier");

    consume(TokenType::In, "'in'");

    ptr<Expression> iterable = expression();

    functionCounter++;
    ptr<StatementBlock> statBlock = statementBlock();
    functionCounter--;

    return make<ForStatement>(identifier, iterable, statBlock);
}